

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O1

void re2::REArgTestInt16Test(void)

{
  ostringstream *poVar1;
  char cVar2;
  char *__s;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  int16 r;
  short local_1b2;
  LogMessage local_1b0;
  
  poVar1 = &local_1b0.str_;
  lVar5 = 0x10;
  do {
    __s = *(char **)((long)&PTR__GLOBAL__sub_I_test_cc_001470c0 + lVar5);
    sVar4 = strlen(__s);
    bVar3 = RE2::Arg::parse_short(__s,(int)sVar4,&local_1b2);
    cVar2 = *(char *)((long)&kSuccessTable + lVar5);
    if ((bool)cVar2 != bVar3) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Check failed: (retval) == (success)",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Parsing \'",9);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\' for type int16 should return ",0x1f);
      std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    if ((cVar2 != '\0') &&
       (*(short *)((long)&__do_global_dtors_aux_fini_array_entry + lVar5) != local_1b2)) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Check failed: (r) == ((int16)kSuccessTable[i].value)",
                 0x34);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x268);
  return;
}

Assistant:

TEST(REArgTest, Int16Test) {
  PARSE_FOR_TYPE(int16, 0);
}